

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_model<_IO_FILE*,int,unsigned_long>
               (TreesIndexer *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  SingleTreeIndex *pSVar1;
  SingleTreeIndex *tree;
  SingleTreeIndex *node;
  size_t vec_size;
  size_type local_30;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>(&local_30,1,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&local_30,1);
    }
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize(&model->indices,local_30)
    ;
    if ((model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>,_true>
      ::_S_do_it(&model->indices);
    }
    pSVar1 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (node = (model->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start; node != pSVar1; node = node + 1) {
      deserialize_node<_IO_FILE*,int,unsigned_long>(node,in,buffer,diff_endian);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>(&vec_size, (size_t)1, in, buffer, diff_endian);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node<itype, saved_int_t, saved_size_t>(tree, in, buffer, diff_endian);
}